

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O2

double boxcox_loglik(double lambda,void *params)

{
  double dVar1;
  double dVar2;
  double *vec;
  ulong uVar3;
  ulong uVar4;
  uint N;
  double local_58;
  
  N = (uint)*params;
  vec = (double *)malloc((long)(int)N * 8);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)N) {
    uVar3 = (ulong)N;
  }
  local_58 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = log(*(double *)((long)params + uVar4 * 8 + 8));
    vec[uVar4] = dVar1;
    local_58 = local_58 + dVar1;
  }
  if ((lambda != 0.0) || (NAN(lambda))) {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dVar1 = pow(*(double *)((long)params + uVar4 * 8 + 8),lambda);
      vec[uVar4] = dVar1 / lambda;
    }
  }
  dVar2 = var(vec,N);
  dVar1 = *params;
  dVar2 = log(dVar2);
  free(vec);
  return -(dVar2 * dVar1 * -0.5 + (lambda + -1.0) * local_58);
}

Assistant:

double boxcox_loglik(double lambda, void *params) {
    double loglik,variance,sum;
    int N,i;
    double *tdata;
    double *xpar = (double*) params;

    N = (int) xpar[0];
    tdata = (double*) malloc(sizeof(double) *N);

    sum = 0.0;
    for(i = 0; i < N;++i) {
        tdata[i] = log(xpar[i+1]);
        sum += tdata[i];
    }

    if (lambda == 0) {
        variance = var(tdata,N);
    } else {
        for(i = 0; i < N;++i) {
            tdata[i] = pow(xpar[i+1],lambda) / lambda;
        }
        variance = var(tdata,N);
    }

    loglik = (lambda-1)*sum - (xpar[0]/2.0)*log(variance);

    free(tdata);
    return -loglik;
}